

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<unsigned_int>(void)

{
  int iVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined8 in_RAX;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  if (ConstCastTestT<unsigned_int>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::b);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::b = SVar2.m_int != 0;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::b);
    }
  }
  if (ConstCastTestT<unsigned_int>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::w);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::w =
           SafeInt::operator_cast_to_wchar_t((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::w);
    }
  }
  if (ConstCastTestT<unsigned_int>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::c);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::c =
           SafeInt::operator_cast_to_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::c);
    }
  }
  if (ConstCastTestT<unsigned_int>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::sc);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::sc =
           SafeInt::operator_cast_to_signed_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_int>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::uc);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::uc =
           SafeInt::operator_cast_to_unsigned_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_int>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::s);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::s =
           SafeInt::operator_cast_to_short((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::s);
    }
  }
  if (ConstCastTestT<unsigned_int>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::us);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::us =
           SafeInt::operator_cast_to_unsigned_short((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::us);
    }
  }
  if (ConstCastTestT<unsigned_int>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::i);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::i =
           SafeInt::operator_cast_to_int((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::i);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ui);
    if (iVar1 != 0) {
      ConstCastTestT<unsigned_int>::ui = (uint)ConstSafeInt<unsigned_int>();
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_int>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::l);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::l = (long)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::l);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ul);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ul = (unsigned_long)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ll);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ll = (longlong)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ull);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ull = (unsigned_long_long)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_int>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::st);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::st = (size_t)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::st);
    }
  }
  if (ConstCastTestT<unsigned_int>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::pt);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::pt = (ptrdiff_t)SVar2.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_int>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::pl);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_int>();
      uStack_8 = CONCAT44(SVar2.m_int,(undefined4)uStack_8);
      ConstCastTestT<unsigned_int>::pl =
           SafeInt::operator_cast_to_int((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}